

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonutils.cpp
# Opt level: O2

colvec * colvec_from_json(colvec *__return_storage_ptr__,json *json_node)

{
  uint __line;
  bool bVar1;
  const_reference pvVar2;
  char *__assertion;
  vector<double,_std::allocator<double>_> raw_data;
  string data;
  string base64_data;
  
  pvVar2 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       *)json_node,"type");
  bVar1 = nlohmann::json_abi_v3_11_3::operator==<const_char_*,_0>(pvVar2,"colvec");
  if (bVar1) {
    pvVar2 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)json_node,"base64_data");
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&base64_data,pvVar2);
    base64_decode(&data,&base64_data,false);
    deserialize<double>(&raw_data,(uint8_t *)data._M_dataplus._M_p,data._M_string_length);
    pvVar2 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)json_node,"size");
    bVar1 = nlohmann::json_abi_v3_11_3::operator==<unsigned_long,_0>
                      ((long)raw_data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)raw_data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start >> 3,pvVar2);
    if (bVar1) {
      arma::Col<double>::Col(__return_storage_ptr__,&raw_data);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&raw_data.super__Vector_base<double,_std::allocator<double>_>);
      std::__cxx11::string::~string((string *)&data);
      std::__cxx11::string::~string((string *)&base64_data);
      return __return_storage_ptr__;
    }
    __assertion = "raw_data.size() == json_node[\"size\"]";
    __line = 0x62;
  }
  else {
    __assertion = "json_node[\"type\"] == \"colvec\"";
    __line = 0x5e;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/libKriging[P]libKriging/src/lib/utils/jsonutils.cpp"
                ,__line,"arma::colvec colvec_from_json(const nlohmann::json &)");
}

Assistant:

LIBKRIGING_EXPORT arma::colvec colvec_from_json(const nlohmann::json& json_node) {
  assert(json_node["type"] == "colvec");
  std::string base64_data = json_node["base64_data"];
  const std::string data = base64_decode(base64_data);
  std::vector<double> raw_data = deserialize<double>(reinterpret_cast<const uint8_t*>(data.data()), data.size());
  assert(raw_data.size() == json_node["size"]);
  return {raw_data};
}